

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shutdown.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  uint *puVar5;
  char local_a8 [8];
  char socket_address [128];
  int eid;
  int rc;
  int s;
  char **argv_local;
  int argc_local;
  
  iVar1 = get_test_port(argc,argv);
  test_addr_from(local_a8,"tcp","127.0.0.1",iVar1);
  iVar1 = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/shutdown.c"
                           ,0x29,1,0x30);
  socket_address._124_4_ =
       test_connect_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/shutdown.c"
                         ,0x2a,iVar1,local_a8);
  iVar2 = nn_shutdown(iVar1,socket_address._124_4_);
  if (iVar2 != 0) {
    nn_backtrace_print();
    __stream = _stderr;
    piVar3 = __errno_location();
    pcVar4 = nn_err_strerror(*piVar3);
    puVar5 = (uint *)__errno_location();
    fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/shutdown.c",
            0x2c);
    fflush(_stderr);
    nn_err_abort();
  }
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/shutdown.c"
                  ,0x2d,iVar1);
  return 0;
}

Assistant:

int main (int argc, const char *argv[])
{
    int s;
    int rc;
    int eid;
    char socket_address[128];

    test_addr_from(socket_address, "tcp", "127.0.0.1",
            get_test_port(argc, argv));

    /*  Run endpoint shutdown and socket shutdown in parallel. */
    s = test_socket (AF_SP, NN_REQ);
    eid = test_connect (s, socket_address);
    rc = nn_shutdown (s, eid);
    errno_assert (rc == 0);
    test_close (s);

    return 0;
}